

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_log.cpp
# Opt level: O0

int anon_unknown.dwarf_46601::trace_indent_line(TraceState *state)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  size_t sVar4;
  bool local_1d;
  int width;
  TraceState *state_local;
  
  bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(&state->current_depths);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state.current_depths.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/trace_log.cpp"
                  ,0x34,"int (anonymous namespace)::trace_indent_line(TraceState &)");
  }
  pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&state->current_depths);
  uVar2 = *pvVar3 << 1;
  if ((int)uVar2 < 1) {
    state_local._4_4_ = 0;
  }
  else {
    local_1d = 0x9f < uVar2;
    if (local_1d) {
      __assert_fail("width >=0 && width< 160",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/trace_log.cpp"
                    ,0x39,"int (anonymous namespace)::trace_indent_line(TraceState &)");
    }
    sVar4 = fwrite("                                                                                                                                                                                                                                                      "
                   ,1,(long)(int)uVar2,(FILE *)state->report);
    state_local._4_4_ = (int)sVar4;
  }
  return state_local._4_4_;
}

Assistant:

int trace_indent_line(TraceState &state) {
	static const char spaces[]="                                                                                                                                                                                                                                                      ";

	assert(!state.current_depths.empty());
	int width = state.current_depths.top() * 2;

	if (width <= 0) return 0;

	assert(width >=0 && width< 160);
	return (int)fwrite(spaces, 1, width, state.report);
}